

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O0

int operator<(bdNodeId *a,bdNodeId *b)

{
  int local_34;
  uchar *puStack_30;
  int i;
  uint8_t *b_data;
  uint8_t *a_data;
  bdNodeId *b_local;
  bdNodeId *a_local;
  
  local_34 = 0;
  puStack_30 = b->data;
  b_data = a->data;
  while( true ) {
    if (0x13 < local_34) {
      return 0;
    }
    if (*b_data < *puStack_30) break;
    if (*puStack_30 < *b_data) {
      return 0;
    }
    b_data = b_data + 1;
    puStack_30 = puStack_30 + 1;
    local_34 = local_34 + 1;
  }
  return 1;
}

Assistant:

int operator<(const bdNodeId &a, const bdNodeId &b) {
#if 0
	std::cerr <<  "operator<(");
	bdPrintNodeId(std::cerr, &a);
	std::cerr <<  ",";
	bdPrintNodeId(std::cerr, &b);
	std::cerr <<  ")" << std::endl;
#endif
	
	uint8_t *a_data = (uint8_t *) a.data;
	uint8_t *b_data = (uint8_t *) b.data;
	for (int i = 0; i < BITDHT_KEY_LEN; i++)
	{
		if (*a_data < *b_data) {
			//fprintf(stderr, "Return 1, at i = %d\n", i);
			return 1;
		}
		else if (*a_data > *b_data) {
			//fprintf(stderr, "Return 0, at i = %d\n", i);
			return 0;
		}
		a_data++;
		b_data++;
	}
	//fprintf(stderr, "Return 0, at i = KEYLEN\n");
	return 0;
}